

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::
ForEach<google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
          (ExtensionSet *this)

{
  bool bVar1;
  KeyValue *pKVar2;
  KeyValue *pKVar3;
  undefined8 in_R9;
  iterator iVar4;
  iterator iVar5;
  undefined8 func;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  ExtensionSet *this_local;
  
  bVar1 = is_large(this);
  if (bVar1) {
    iVar4 = absl::lts_20240722::container_internal::
            btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
            ::begin((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                     *)(this->map_).flat);
    iVar5 = absl::lts_20240722::container_internal::
            btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
            ::end((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
                   *)(this->map_).flat);
    ForEachPrefetchImpl<absl::lts_20240722::container_internal::btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
              (iVar4.node_,iVar4.position_,iVar5.node_,iVar5.position_,in_stack_00000018,in_R9,func,
               in_stack_00000010,in_stack_00000018,in_stack_00000020);
  }
  else {
    pKVar2 = flat_begin(this);
    pKVar3 = flat_end(this);
    ForEachPrefetchImpl<google::protobuf::internal::ExtensionSet::KeyValue_const*,google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
              (pKVar2,pKVar3);
  }
  return;
}

Assistant:

void ForEach(KeyValueFunctor func, PrefetchFunctor prefetch_func) const {
    if (PROTOBUF_PREDICT_FALSE(is_large())) {
      ForEachPrefetchImpl(map_.large->begin(), map_.large->end(),
                          std::move(func), std::move(prefetch_func));
      return;
    }
    ForEachPrefetchImpl(flat_begin(), flat_end(), std::move(func),
                        std::move(prefetch_func));
  }